

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SaveSettings(void)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ulong uVar5;
  ImGuiIniData *pIVar6;
  FILE *__stream;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  
  pIVar4 = GImGui;
  pcVar8 = (GImGui->IO).IniFilename;
  if (pcVar8 != (char *)0x0) {
    uVar2 = (GImGui->Windows).Size;
    uVar5 = (ulong)uVar2;
    if (uVar2 != 0) {
      uVar10 = 0;
      do {
        if ((long)(int)uVar5 <= (long)uVar10) {
          pcVar8 = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
          goto LAB_001322a2;
        }
        pIVar3 = (pIVar4->Windows).Data[uVar10];
        if ((pIVar3->Flags & 0x100) == 0) {
          pIVar6 = FindWindowSettings(pIVar3->Name);
          pIVar6->Pos = pIVar3->Pos;
          pIVar6->Size = pIVar3->SizeFull;
          pIVar6->Collapsed = pIVar3->Collapsed;
        }
        uVar10 = uVar10 + 1;
        uVar5 = (ulong)(uint)(pIVar4->Windows).Size;
      } while (uVar10 != uVar5);
    }
    __stream = fopen(pcVar8,"wt");
    if (__stream != (FILE *)0x0) {
      uVar2 = (pIVar4->Settings).Size;
      uVar5 = (ulong)uVar2;
      if (uVar2 != 0) {
        lVar9 = 0x1c;
        uVar10 = 0;
        do {
          if ((long)(int)uVar5 <= (long)uVar10) {
            pcVar8 = "value_type &ImVector<ImGuiIniData>::operator[](int) [T = ImGuiIniData]";
LAB_001322a2:
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                          ,0x353,pcVar8);
          }
          pIVar6 = (pIVar4->Settings).Data;
          fVar1 = *(float *)((long)pIVar6 + lVar9 + -0x10);
          if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
            pcVar8 = *(char **)((long)pIVar6 + lVar9 + -0x1c);
            pcVar7 = strstr(pcVar8,"###");
            if (pcVar7 != (char *)0x0) {
              pcVar8 = pcVar7;
            }
            fprintf(__stream,"[%s]\n",pcVar8);
            fprintf(__stream,"Pos=%d,%d\n",
                    (ulong)(uint)(int)*(float *)((long)pIVar6 + lVar9 + -0x10),
                    (ulong)(uint)(int)*(float *)((long)pIVar6 + lVar9 + -0xc));
            fprintf(__stream,"Size=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar6 + lVar9 + -8),
                    (ulong)(uint)(int)*(float *)((long)pIVar6 + lVar9 + -4));
            fprintf(__stream,"Collapsed=%d\n",(ulong)*(byte *)((long)&pIVar6->Name + lVar9));
            fputc(10,__stream);
          }
          uVar10 = uVar10 + 1;
          uVar5 = (ulong)(uint)(pIVar4->Settings).Size;
          lVar9 = lVar9 + 0x20;
        } while (uVar10 != uVar5);
      }
      fclose(__stream);
      return;
    }
  }
  return;
}

Assistant:

static void SaveSettings()
{
    ImGuiContext& g = *GImGui;
    const char* filename = g.IO.IniFilename;
    if (!filename)
        return;

    // Gather data from windows that were active during this session
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;
        ImGuiIniData* settings = FindWindowSettings(window->Name);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write .ini file
    // If a window wasn't opened in this session we preserve its settings
    FILE* f = fopen(filename, "wt");
    if (!f)
        return;
    for (int i = 0; i != g.Settings.Size; i++)
    {
        const ImGuiIniData* settings = &g.Settings[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        fprintf(f, "[%s]\n", name);
        fprintf(f, "Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        fprintf(f, "Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        fprintf(f, "Collapsed=%d\n", settings->Collapsed);
        fprintf(f, "\n");
    }

    fclose(f);
}